

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

void object_curses_find_to_h(player *p,object *obj)

{
  wchar_t wVar1;
  long lVar2;
  wchar_t i;
  ulong uVar3;
  
  wVar1 = rune_index(0,L'\x01');
  if (obj->curses != (curse_data *)0x0) {
    lVar2 = 10;
    for (uVar3 = 1; uVar3 < z_info->curse_max; uVar3 = uVar3 + 1) {
      if (((obj->curses[uVar3].power != L'\0') &&
          (*(long *)(curses->conflict_flags + lVar2 * 8 + -0x28) != 0)) &&
         (*(short *)(*(long *)(curses->conflict_flags + lVar2 * 8 + -0x28) + 0x48) != 0)) {
        player_learn_rune(p,(long)wVar1,true);
        wVar1 = rune_index(5,(wchar_t)uVar3);
        if (L'\xffffffff' < wVar1) {
          player_learn_rune(p,(ulong)(uint)wVar1,true);
        }
      }
      lVar2 = lVar2 + 7;
    }
  }
  return;
}

Assistant:

static void object_curses_find_to_h(struct player *p, struct object *obj)
{
	int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; i++) {
			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			if (curses[i].obj->to_h != 0) {
				player_learn_rune(p, index, true);

				/* Learn the curse */
				index = rune_index(RUNE_VAR_CURSE, i);
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
			}
		}
	}
}